

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.cpp
# Opt level: O1

void density_tests::all_queues_generic_tests
               (TestSettings *i_settings,QueueTesterFlags i_flags,ostream *i_output,
               uint32_t i_random_seed)

{
  bool bVar1;
  ulong uVar2;
  uint64_t uVar3;
  long lVar4;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonblocking_thread_counts;
  EasyRandom rand;
  allocator_type local_13c9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_13c8;
  unsigned_long local_13b0;
  EasyRandom local_13a8;
  
  if (i_random_seed == 0) {
    EasyRandom::EasyRandom(&local_13a8);
  }
  else {
    local_13a8.m_rand._M_x[0] = (unsigned_long)i_random_seed;
    lVar4 = 1;
    uVar2 = local_13a8.m_rand._M_x[0];
    do {
      uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar4);
      local_13a8.m_rand._M_x[lVar4] = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    local_13a8.m_rand._M_p = 0x270;
    local_13a8.m_deterministic = true;
  }
  uVar3 = get_num_of_processors();
  local_13b0 = (uVar3 + (uVar3 == 0)) * 4;
  __l._M_len = 1;
  __l._M_array = &local_13b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_13c8,__l,&local_13c9);
  bVar1 = TestSettings::should_run(i_settings,"queue");
  if (bVar1) {
    heter_queue_generic_tests(i_flags,i_output,&local_13a8,i_settings->m_queue_tests_cardinality);
  }
  bVar1 = TestSettings::should_run(i_settings,"conc_queue");
  if (bVar1) {
    concurr_heter_queue_generic_tests
              (i_flags,i_output,&local_13a8,i_settings->m_queue_tests_cardinality);
  }
  bVar1 = TestSettings::should_run(i_settings,"lf_queue");
  if (bVar1) {
    bVar1 = TestSettings::should_run(i_settings,"relaxed");
    if (bVar1) {
      lf_heter_relaxed_queue_generic_tests(i_settings,i_flags,i_output,&local_13a8,&local_13c8);
    }
    bVar1 = TestSettings::should_run(i_settings,"seq_cnst");
    if (bVar1) {
      lf_heter_seq_cst_queue_generic_tests(i_settings,i_flags,i_output,&local_13a8,&local_13c8);
    }
  }
  bVar1 = TestSettings::should_run(i_settings,"sp_queue");
  if (bVar1) {
    sp_heter_generic_tests(i_flags,i_output,&local_13a8,i_settings->m_queue_tests_cardinality);
  }
  if (local_13c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_13c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void all_queues_generic_tests(
      const TestSettings & i_settings,
      QueueTesterFlags     i_flags,
      std::ostream &       i_output,
      uint32_t             i_random_seed)
    {
        EasyRandom rand      = i_random_seed == 0 ? EasyRandom() : EasyRandom(i_random_seed);
        uint64_t   cpu_count = get_num_of_processors();
        if (cpu_count == 0)
            cpu_count = 1;

#if defined(__GNUC__) && !defined(__clang__)
        /* on travis gcc builds take more time, so we use lees threads. 
                to do: expose the number of threads with a commandline argument */
        std::vector<size_t> const nonblocking_thread_counts{static_cast<size_t>(cpu_count * 2)};
#else
        std::vector<size_t> const nonblocking_thread_counts{static_cast<size_t>(cpu_count * 4)};
#endif

        if (i_settings.should_run("queue"))
            heter_queue_generic_tests(
              i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);

        if (i_settings.should_run("conc_queue"))
            concurr_heter_queue_generic_tests(
              i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);

        if (i_settings.should_run("lf_queue"))
        {
            if (i_settings.should_run("relaxed"))
                lf_heter_relaxed_queue_generic_tests(
                  i_settings, i_flags, i_output, rand, nonblocking_thread_counts);

            if (i_settings.should_run("seq_cnst"))
                lf_heter_seq_cst_queue_generic_tests(
                  i_settings, i_flags, i_output, rand, nonblocking_thread_counts);
        }

        if (i_settings.should_run("sp_queue"))
            sp_heter_generic_tests(i_flags, i_output, rand, i_settings.m_queue_tests_cardinality);
    }